

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O3

bool anon_unknown.dwarf_224fb3::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *ph,int lx,int rx,int ly,int ry,int width)

{
  ostream *poVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  bVar4 = true;
  if (ly <= ry) {
    iVar3 = ly * width;
    puVar5 = ph->_data + ph->_sizeY * (long)ly;
    bVar4 = false;
    lVar8 = (long)ly;
    do {
      lVar7 = (long)lx;
      if (lx <= rx) {
        do {
          uVar6 = (iVar3 + (int)lVar7) % 0x801;
          if (puVar5[lVar7] != uVar6) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
            poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", should be ",0xc);
            plVar2 = (long *)std::ostream::operator<<(poVar1,uVar6);
            std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
            std::ostream::put((char)plVar2);
            std::ostream::flush();
            std::ostream::flush();
            return bVar4;
          }
          lVar7 = lVar7 + 1;
        } while (rx + 1 != (int)lVar7);
      }
      lVar7 = lVar8 + 1;
      bVar4 = ry <= lVar8;
      iVar3 = iVar3 + width;
      puVar5 = puVar5 + ph->_sizeY;
      lVar8 = lVar7;
    } while (ry + 1 != (int)lVar7);
  }
  return bVar4;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            if (ph[y][x] != static_cast<T> (((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl
                     << flush;
                return false;
            }
        }
    }

    return true;
}